

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

R_conflict6 millisToWithinRange(qint64 millis)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  R_conflict6 RVar3;
  YearMonthDay YVar4;
  qint64 jd;
  YearMonthDay ymd;
  optional<long_long> fakeJd;
  R_conflict6 result;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  qint64 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar5;
  int year;
  int in_stack_ffffffffffffffc4;
  qint64 in_stack_ffffffffffffffd8;
  R local_18;
  long local_8;
  
  year = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.spans = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.nSpans = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  R::R(&local_18);
  msecsToJulianDay(0x1f1ef7);
  YVar4 = QGregorianCalendar::partsFromJulian(in_stack_ffffffffffffffd8);
  uVar2 = YVar4._4_8_;
  systemTimeYearMatching(year);
  QGregorianCalendar::julianFromParts
            (in_stack_ffffffffffffffc4,(int)((ulong)uVar2 >> 0x20),(int)uVar2);
  bVar1 = std::optional::operator_cast_to_bool((optional<long_long> *)0x1f1f7b);
  bVar5 = 0;
  uVar2 = extraout_RDX;
  if (bVar1) {
    std::optional<long_long>::operator*((optional<long_long> *)0x1f1f94);
    bVar1 = daysAndMillisOverflow
                      (CONCAT17(bVar5,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
                       (qint64 *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    bVar5 = bVar1 ^ 0xff;
    uVar2 = extraout_RDX_00;
  }
  local_18.nSpans = CONCAT71(local_18.nSpans._1_7_,bVar5) & 0xffffffffffffff01;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  RVar3._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  RVar3.good = (bool)(undefined1)local_18.nSpans;
  RVar3.shifted = (qint64)local_18.spans;
  return RVar3;
}

Assistant:

static auto millisToWithinRange(qint64 millis)
{
    struct R {
        qint64 shifted = 0;
        bool good = false;
    } result;
    qint64 jd = msecsToJulianDay(millis);
    auto ymd = QGregorianCalendar::partsFromJulian(jd);
    const auto fakeJd = QGregorianCalendar::julianFromParts(systemTimeYearMatching(ymd.year),
                                                            ymd.month, ymd.day);
    result.good = fakeJd && !daysAndMillisOverflow(*fakeJd - jd, millis, &result.shifted);
    return result;
}